

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_list * mg_list_make_empty(uint32_t capacity)

{
  uint32_t in_EDI;
  mg_list *list;
  mg_list *local_8;
  
  local_8 = mg_list_alloc(capacity,(mg_allocator *)list);
  if (local_8 == (mg_list *)0x0) {
    local_8 = (mg_list *)0x0;
  }
  else {
    local_8->size = 0;
    local_8->capacity = in_EDI;
  }
  return local_8;
}

Assistant:

mg_list *mg_list_make_empty(uint32_t capacity) {
  mg_list *list = mg_list_alloc(capacity, &mg_system_allocator);
  if (!list) {
    return NULL;
  }
  list->size = 0;
  list->capacity = capacity;
  return list;
}